

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void __thiscall Fl_Widget_Class_Type::write_code1(Fl_Widget_Class_Type *this)

{
  Fl_Widget *pFVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  current_widget_class = this;
  this->write_public_state = '\x01';
  pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.subclass_;
  pcVar5 = "Fl_Group";
  if (pcVar2 != (char *)0x0) {
    pcVar5 = pcVar2;
  }
  Fl_Type::write_comment_h((Fl_Type *)this,"");
  write_h("\nclass %s : public %s {\n",
          (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_,pcVar5);
  pcVar2 = strstr(pcVar5,"Window");
  if (pcVar2 == (char *)0x0) {
    write_h("public:\n");
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    do {
      pcVar4 = pcVar2;
      pcVar3 = strstr(pcVar4,"::");
      pcVar2 = pcVar3 + 2;
    } while (pcVar3 != (char *)0x0);
    write_h("  %s(int X, int Y, int W, int H, const char *L = 0);\n",pcVar4);
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    pcVar3 = pcVar2;
    do {
      pcVar6 = pcVar3;
      pcVar4 = strstr(pcVar6,"::");
      pcVar3 = pcVar4 + 2;
    } while (pcVar4 != (char *)0x0);
    write_c("%s::%s(int X, int Y, int W, int H, const char *L)\n",pcVar2,pcVar6);
    if (this->wc_relative == '\0') {
      pcVar2 = "  : %s(X, Y, W, H, L) {\n";
    }
    else {
      pcVar2 = "  : %s(0, 0, W, H, L) {\n";
    }
    write_c(pcVar2,pcVar5);
  }
  else {
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    do {
      pcVar4 = pcVar2;
      pcVar3 = strstr(pcVar4,"::");
      pcVar2 = pcVar3 + 2;
    } while (pcVar3 != (char *)0x0);
    write_h("  void _%s();\n",pcVar4);
    write_h("public:\n");
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    do {
      pcVar4 = pcVar2;
      pcVar3 = strstr(pcVar4,"::");
      pcVar2 = pcVar3 + 2;
    } while (pcVar3 != (char *)0x0);
    write_h("  %s(int X, int Y, int W, int H, const char *L = 0);\n",pcVar4);
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    do {
      pcVar4 = pcVar2;
      pcVar3 = strstr(pcVar4,"::");
      pcVar2 = pcVar3 + 2;
    } while (pcVar3 != (char *)0x0);
    write_h("  %s(int W, int H, const char *L = 0);\n",pcVar4);
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    do {
      pcVar4 = pcVar2;
      pcVar3 = strstr(pcVar4,"::");
      pcVar2 = pcVar3 + 2;
    } while (pcVar3 != (char *)0x0);
    write_h("  %s();\n",pcVar4);
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    pcVar3 = pcVar2;
    do {
      pcVar6 = pcVar3;
      pcVar4 = strstr(pcVar6,"::");
      pcVar3 = pcVar4 + 2;
    } while (pcVar4 != (char *)0x0);
    write_c("%s::%s(int X, int Y, int W, int H, const char *L)\n",pcVar2,pcVar6);
    write_c("  : %s(X, Y, W, H, L) {\n",pcVar5);
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    do {
      pcVar4 = pcVar2;
      pcVar3 = strstr(pcVar4,"::");
      pcVar2 = pcVar3 + 2;
    } while (pcVar3 != (char *)0x0);
    write_c("  _%s();\n",pcVar4);
    write_c("}\n\n");
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    pcVar3 = pcVar2;
    do {
      pcVar6 = pcVar3;
      pcVar4 = strstr(pcVar6,"::");
      pcVar3 = pcVar4 + 2;
    } while (pcVar4 != (char *)0x0);
    write_c("%s::%s(int W, int H, const char *L)\n",pcVar2,pcVar6);
    write_c("  : %s(0, 0, W, H, L) {\n",pcVar5);
    write_c("  clear_flag(16);\n");
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    do {
      pcVar4 = pcVar2;
      pcVar3 = strstr(pcVar4,"::");
      pcVar2 = pcVar3 + 2;
    } while (pcVar3 != (char *)0x0);
    write_c("  _%s();\n",pcVar4);
    write_c("}\n\n");
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    pcVar3 = pcVar2;
    do {
      pcVar6 = pcVar3;
      pcVar4 = strstr(pcVar6,"::");
      pcVar3 = pcVar4 + 2;
    } while (pcVar4 != (char *)0x0);
    write_c("%s::%s()\n",pcVar2,pcVar6);
    pFVar1 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.o;
    write_c("  : %s(0, 0, %d, %d, ",pcVar5,(ulong)(uint)pFVar1->w_,(ulong)(uint)pFVar1->h_);
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.label_;
    if (pcVar2 == (char *)0x0) {
      write_c("0");
    }
    else {
      write_cstring(pcVar2);
    }
    write_c(") {\n");
    write_c("  clear_flag(16);\n");
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    do {
      pcVar3 = pcVar2;
      pcVar5 = strstr(pcVar3,"::");
      pcVar2 = pcVar5 + 2;
    } while (pcVar5 != (char *)0x0);
    write_c("  _%s();\n",pcVar3);
    write_c("}\n\n");
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    pcVar5 = pcVar2;
    do {
      pcVar4 = pcVar5;
      pcVar3 = strstr(pcVar4,"::");
      pcVar5 = pcVar3 + 2;
    } while (pcVar3 != (char *)0x0);
    write_c("void %s::_%s() {\n",pcVar2,pcVar4);
  }
  Fl_Widget_Type::write_widget_code((Fl_Widget_Type *)this);
  return;
}

Assistant:

void Fl_Widget_Class_Type::write_code1() {
#if 0
  Fl_Widget_Type::write_code1();
#endif // 0

  current_widget_class = this;
  write_public_state = 1;

  const char *c = subclass();
  if (!c) c = "Fl_Group";

  write_comment_h();
  write_h("\nclass %s : public %s {\n", name(), c);
  if (strstr(c, "Window")) {
    write_h("  void _%s();\n", trimclassname(name()));
    write_h("public:\n");
    write_h("  %s(int X, int Y, int W, int H, const char *L = 0);\n", trimclassname(name()));
    write_h("  %s(int W, int H, const char *L = 0);\n", trimclassname(name()));
    write_h("  %s();\n", trimclassname(name()));

    // a constructor with all four dimensions plus label
    write_c("%s::%s(int X, int Y, int W, int H, const char *L)\n", name(), trimclassname(name()));
    write_c("  : %s(X, Y, W, H, L) {\n", c);
    write_c("  _%s();\n", trimclassname(name()));
    write_c("}\n\n");

    // a constructor with just the size and label. The window manager will position the window
    write_c("%s::%s(int W, int H, const char *L)\n", name(), trimclassname(name()));
    write_c("  : %s(0, 0, W, H, L) {\n", c);
    write_c("  clear_flag(16);\n");
    write_c("  _%s();\n", trimclassname(name()));
    write_c("}\n\n");
    
    // a constructor that takes size and label from the Fluid database
    write_c("%s::%s()\n", name(), trimclassname(name()));
    write_c("  : %s(0, 0, %d, %d, ", c, o->w(), o->h());
    const char *cstr = label();
    if (cstr) write_cstring(cstr);
    else write_c("0");
    write_c(") {\n");
    write_c("  clear_flag(16);\n");
    write_c("  _%s();\n", trimclassname(name()));
    write_c("}\n\n");
    
    write_c("void %s::_%s() {\n", name(), trimclassname(name()));
//    write_c("  %s *w = this;\n", name());
  } else {
    write_h("public:\n");
    write_h("  %s(int X, int Y, int W, int H, const char *L = 0);\n", trimclassname(name()));

    write_c("%s::%s(int X, int Y, int W, int H, const char *L)\n", name(), trimclassname(name()));
    if (wc_relative)
      write_c("  : %s(0, 0, W, H, L) {\n", c);
    else
      write_c("  : %s(X, Y, W, H, L) {\n", c);
  }

//  write_c("  %s *o = this;\n", name());

  write_widget_code();
}